

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_make_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int type,float v,Option *opt
               )

{
  Layer *this;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  int in_stack_00000008;
  undefined8 in_stack_00000010;
  ParamDict pd;
  Layer *padding;
  int in_stack_ffffffffffffffbc;
  ParamDict *in_stack_ffffffffffffffc0;
  
  this = create_layer(in_stack_ffffffffffffffbc);
  ParamDict::ParamDict(in_stack_ffffffffffffffc0);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,0,in_EDX);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,1,in_ECX);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,2,in_R8D);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,3,in_R9D);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,4,in_stack_00000008);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffc0,5,in_XMM0_Da);
  (*this->_vptr_Layer[2])(this,&stack0xffffffffffffffc0);
  (*this->_vptr_Layer[4])(this,in_stack_00000010);
  (*this->_vptr_Layer[7])(this,in_RDI,in_RSI,in_stack_00000010);
  (*this->_vptr_Layer[5])(this,in_stack_00000010);
  if (this != (Layer *)0x0) {
    (*this->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict((ParamDict *)this);
  return;
}

Assistant:

void copy_make_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int type, float v, const Option& opt)
{
    Layer* padding = create_layer(LayerType::Padding);

    ParamDict pd;
    pd.set(0, top);
    pd.set(1, bottom);
    pd.set(2, left);
    pd.set(3, right);
    pd.set(4, type);
    pd.set(5, v);

    padding->load_param(pd);

    padding->create_pipeline(opt);

    padding->forward(src, dst, opt);

    padding->destroy_pipeline(opt);

    delete padding;
}